

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_memprof.c
# Opt level: O2

void memprof_write_cfunc(lj_wbuf *out,uint8_t aevent,GCfunc *fn,lua_State *L,uint32_t *lib_adds)

{
  undefined4 uVar1;
  ulong uVar2;
  
  uVar2 = (ulong)(L->glref).ptr32;
  uVar1 = *(undefined4 *)(uVar2 + 0x160);
  *(undefined4 *)(uVar2 + 0x160) = 0xffffffff;
  lj_symtab_dump_newc(lib_adds,out,'\f',L);
  *(undefined4 *)(uVar2 + 0x160) = uVar1;
  lj_wbuf_addbyte(out,aevent | 0xc);
  lj_wbuf_addu64(out,(uint64_t)(fn->c).f);
  return;
}

Assistant:

static void memprof_write_cfunc(struct lj_wbuf *out, uint8_t aevent,
				const GCfunc *fn, lua_State *L,
				uint32_t *lib_adds)
{
#if LJ_HASRESOLVER
  /* Check if there are any new libs. */
  /*
  ** XXX: Leaving the `vmstate` unchanged leads to an infinite
  ** recursion, because allocations inside ELF parser are treated
  ** as C-side allocations by memrpof. Setting the `vmstate` to
  ** LJ_VMST_INTERP solves the issue.
  */
  global_State *g = G(L);
  const uint32_t ostate = g->vmstate;
  g->vmstate = ~LJ_VMST_INTERP;
  lj_symtab_dump_newc(lib_adds, out, AEVENT_SYMTAB | ASOURCE_CFUNC, L);
  /* Restore vmstate. */
  g->vmstate = ostate;
#else
  UNUSED(lib_adds);
#endif

  lj_wbuf_addbyte(out, aevent | ASOURCE_CFUNC);
  lj_wbuf_addu64(out, (uintptr_t)fn->c.f);
}